

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O2

void addEdgesFromNotMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  string *psVar3;
  string *temp;
  string out;
  CTemp defTemp;
  string def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  string local_148;
  CTemp local_128;
  string local_108;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*((line->command).super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_AssemblyCommand[1])(&local_e8);
  psVar3 = (string *)
           local_e8.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (psVar3 == (string *)
                  local_e8.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_e8);
      return;
    }
    std::__cxx11::string::string((string *)&local_128,psVar3);
    for (p_Var2 = (line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 1));
      IRT::CTemp::ToString_abi_cxx11_(&local_70,&local_128);
      bVar1 = std::operator!=(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        IRT::CTemp::ToString_abi_cxx11_(&local_70,&local_128);
        std::__cxx11::string::string((string *)&local_148,(string *)&local_50);
        bVar1 = isInIgnoreList(&local_70);
        if (!bVar1) {
          bVar1 = isInIgnoreList(&local_148);
          if (!bVar1) {
            std::__cxx11::string::string((string *)&local_108,(string *)&local_70);
            temp = &local_108;
            bVar1 = isInDynamicIgnoreList(temp,ignoreList);
            if (!bVar1) {
              std::__cxx11::string::string((string *)&local_b0,(string *)&local_148);
              bVar1 = isInDynamicIgnoreList(&local_b0,ignoreList);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_108);
              if (bVar1) goto LAB_00147de4;
              std::__cxx11::string::string((string *)&local_d0,(string *)&local_70);
              std::__cxx11::string::string((string *)&local_90,(string *)&local_148);
              temp = &local_d0;
              AssemblyCode::addNotOrientedEdge(temp,&local_90,graph);
              std::__cxx11::string::~string((string *)&local_90);
            }
            std::__cxx11::string::~string((string *)temp);
          }
        }
LAB_00147de4:
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_128);
    psVar3 = psVar3 + 0x20;
  } while( true );
}

Assistant:

void addEdgesFromNotMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                             std::vector<std::string>& ignoreList) {
    for (auto defTemp : line.command->GetOut()) {
        for (auto outTemp : line.liveOutTemps) {
            if (defTemp.ToString() != outTemp) {
                std::string def = defTemp.ToString( );
                std::string out = outTemp;
                if ( !isInIgnoreList( def ) && !isInIgnoreList( out ) && !isInDynamicIgnoreList(def, ignoreList) && !isInDynamicIgnoreList(out, ignoreList)) {
                    AssemblyCode::addNotOrientedEdge( def, out, graph );
                }
            }
        }
    }
}